

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.cpp
# Opt level: O0

bool __thiscall crnlib::data_stream::read_line(data_stream *this,dynamic_string *str)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  dynamic_string *in_RSI;
  data_stream *in_RDI;
  bool prev_got_cr;
  int c;
  uint in_stack_ffffffffffffffe0;
  
  dynamic_string::empty((dynamic_string *)0x11c2c1);
  while( true ) {
    do {
      iVar3 = read_byte(in_RDI);
      uVar1 = CONCAT13((byte)in_RDI->field_0x1a >> 2,(int3)in_stack_ffffffffffffffe0);
      in_stack_ffffffffffffffe0 = uVar1 & 0x1ffffff;
      in_RDI->field_0x1a = in_RDI->field_0x1a & 0xfb;
      if (iVar3 < 0) {
        bVar2 = dynamic_string::is_empty(in_RSI);
        if (!bVar2) {
          return true;
        }
        return false;
      }
    } while ((iVar3 == 0x1a) || (iVar3 == 0));
    if (iVar3 == 0xd) break;
    if (iVar3 == 10) {
      if ((char)(in_stack_ffffffffffffffe0 >> 0x18) == '\0') {
        return true;
      }
    }
    else {
      dynamic_string::append_char
                ((dynamic_string *)(CONCAT44(iVar3,uVar1) & 0xffffffff01ffffff),
                 (char)((ulong)in_RDI >> 0x38));
    }
  }
  in_RDI->field_0x1a = in_RDI->field_0x1a & 0xfb | 4;
  return true;
}

Assistant:

bool data_stream::read_line(dynamic_string& str) {
  str.empty();

  for (;;) {
    const int c = read_byte();

    const bool prev_got_cr = m_got_cr;
    m_got_cr = false;

    if (c < 0) {
      if (!str.is_empty())
        break;

      return false;
    } else if ((26 == c) || (!c))
      continue;
    else if (13 == c) {
      m_got_cr = true;
      break;
    } else if (10 == c) {
      if (prev_got_cr)
        continue;

      break;
    }

    str.append_char(static_cast<char>(c));
  }

  return true;
}